

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

bool QResource::registerResource(uchar *rccData,QString *resourceRoot)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  QChar *pQVar3;
  QDynamicBufferResourceRoot *this;
  QRecursiveMutex *this_00;
  ResourceList *this_01;
  ushort *puVar4;
  long in_FS_OFFSET;
  QMessageLogger local_80;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d = (resourceRoot->d).d;
  local_60.ptr = (resourceRoot->d).ptr;
  local_60.size = (resourceRoot->d).size;
  if (local_60.d != (Data *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_resource_fixResourceRoot((QString *)&local_48,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
LAB_00237f82:
    this = (QDynamicBufferResourceRoot *)operator_new(0x48);
    anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::QDynamicBufferResourceRoot
              (this,(QString *)&local_48);
    bVar2 = anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::registerSelf(this,rccData,-1);
    if (bVar2) {
      LOCK();
      pQVar1 = &(this->super_QResourceRoot).ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this_00 = resourceMutex();
      QRecursiveMutex::lock(this_00);
      this_01 = resourceList();
      QList<(anonymous_namespace)::QResourceRoot_*>::append(this_01,(parameter_type)this);
      QRecursiveMutex::unlock(this_00);
      bVar2 = true;
      goto LAB_0023802f;
    }
    (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])(this);
  }
  else {
    pQVar3 = QString::data((QString *)&local_48);
    if (pQVar3->ucs == L'/') goto LAB_00237f82;
    local_80.context.version = 2;
    local_80.context.function._4_4_ = 0;
    local_80.context._4_8_ = 0;
    local_80.context._12_8_ = 0;
    local_80.context.category = "default";
    puVar4 = QString::utf16(resourceRoot);
    QMessageLogger::warning
              (&local_80,
               "QDir::registerResource: Registering a resource [%p] must be rooted in an absolute path (start with /) [%ls]"
               ,rccData,puVar4);
  }
  bVar2 = false;
LAB_0023802f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QResource::registerResource(const uchar *rccData, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%p] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 rccData, qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicBufferResourceRoot *root = new QDynamicBufferResourceRoot(r);
    if (root->registerSelf(rccData, -1)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}